

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFourAction.cpp
# Opt level: O2

ActionResults * __thiscall GreenRoomFourAction::Look(GreenRoomFourAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  string *this_00;
  allocator local_71;
  string information;
  string local_50;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == KID) {
    std::__cxx11::string::string
              ((string *)&information,
               "The child in front of you whispers repeatedly :aqua, water, ma\'an, eau, Wasser, vody...."
               ,&local_71);
    pAVar2 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string((string *)&local_30,(string *)&information);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_30);
    this_00 = &local_30;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != CLEAN_BUCKET) {
      pAVar2 = AbstractRoomAction::Look(&this->super_AbstractRoomAction);
      return pAVar2;
    }
    std::__cxx11::string::string
              ((string *)&information,
               "You examine the bucket of ice cool water. You see the child\'s eyes lock on the bucket"
               ,&local_71);
    pAVar2 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string((string *)&local_50,(string *)&information);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_50);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&information);
  return pAVar2;
}

Assistant:

ActionResults * GreenRoomFourAction::Look() {

    if(commands->getMainItem() == KID) {
        std::string information = "The child in front of you whispers repeatedly :"
                "aqua, water, ma'an, eau, Wasser, vody....";
        return new ActionResults(CURRENT, information);
    } else if (commands->getMainItem() == CLEAN_BUCKET) {
        std::string information = "You examine the bucket of ice cool water. You see the child's eyes lock on the bucket";
        return new ActionResults(CURRENT, information);
    } else {
        return AbstractRoomAction::Look();
    }

}